

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMax(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *__return_storage_ptr__,
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,Status *stat,int start,int incr)

{
  uint *puVar1;
  Real RVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  undefined4 uVar11;
  bool bVar12;
  int iVar13;
  pointer pnVar14;
  cpp_dec_float<100U,_int,_void> *pcVar15;
  uint uVar16;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar17;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar18;
  double dVar19;
  cpp_dec_float<100U,_int,_void> *this_00;
  pointer pnVar20;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *l_theShift;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_a68 [72];
  double local_a20;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a10;
  cpp_dec_float<100U,_int,_void> local_a08;
  double local_9b8;
  undefined8 uStack_9b0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_9a0;
  undefined1 local_998 [72];
  undefined8 local_950;
  undefined1 local_948 [72];
  undefined8 local_900;
  cpp_dec_float<100U,_int,_void> *local_8f0;
  Random *local_8e8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8e0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_8d8;
  pointer local_8d0;
  double local_8c8;
  undefined8 uStack_8c0;
  undefined1 local_8b8 [72];
  undefined8 local_870;
  undefined1 local_868 [16];
  cpp_dec_float<100U,_int,_void> *local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  cpp_dec_float<100U,_int,_void> local_838;
  cpp_dec_float<100U,_int,_void> local_7e8;
  uint local_798 [2];
  uint auStack_790 [2];
  uint local_788 [2];
  uint auStack_780 [2];
  uint local_778 [2];
  uint auStack_770 [2];
  uint local_768 [2];
  undefined8 uStack_760;
  uint local_758 [2];
  uint auStack_750 [2];
  uint local_748 [2];
  uint auStack_740 [2];
  uint local_738 [2];
  uint auStack_730 [2];
  uint local_728 [2];
  undefined8 uStack_720;
  cpp_dec_float<100U,_int,_void> local_718;
  cpp_dec_float<100U,_int,_void> local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  undefined1 local_5d8 [80];
  undefined1 local_588 [80];
  cpp_dec_float<100U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  undefined1 local_498 [80];
  undefined1 local_448 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  undefined1 local_3a8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  undefined1 local_2b8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  undefined1 local_1c8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  undefined5 uStack_e8;
  undefined8 local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  local_868._8_8_ = local_868._0_8_;
  local_8d0 = (uvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_7e8.fpclass = cpp_dec_float_finite;
  local_7e8.prec_elem = 0x10;
  local_7e8.data._M_elems[0] = 0;
  local_7e8.data._M_elems[1] = 0;
  local_7e8.data._M_elems[2] = 0;
  local_7e8.data._M_elems[3] = 0;
  local_7e8.data._M_elems[4] = 0;
  local_7e8.data._M_elems[5] = 0;
  local_7e8.data._M_elems[6] = 0;
  local_7e8.data._M_elems[7] = 0;
  local_7e8.data._M_elems[8] = 0;
  local_7e8.data._M_elems[9] = 0;
  local_7e8.data._M_elems[10] = 0;
  local_7e8.data._M_elems[0xb] = 0;
  local_7e8.data._M_elems[0xc] = 0;
  local_7e8.data._M_elems[0xd] = 0;
  local_7e8.data._M_elems._56_5_ = 0;
  local_7e8.data._M_elems[0xf]._1_3_ = 0;
  local_7e8.exp = 0;
  local_7e8.neg = false;
  local_a20 = 3.39519326554444e-313;
  local_a68._0_4_ = 0;
  local_a68._4_4_ = 0;
  local_a68._8_4_ = 0;
  local_a68._12_4_ = 0;
  local_a68._16_4_ = 0;
  local_a68._20_4_ = 0;
  local_a68._24_4_ = 0;
  local_a68._28_4_ = 0;
  local_a68._32_4_ = 0;
  local_a68._36_4_ = 0;
  local_a68._40_4_ = 0;
  local_a68._44_4_ = 0;
  local_a68._48_4_ = 0;
  local_a68._52_4_ = 0;
  local_a68._56_5_ = 0;
  local_a68._61_3_ = 0;
  local_a68._64_4_ = 0;
  local_a68[0x44] = false;
  local_a10 = uvec;
  local_9a0 = this;
  local_8f0 = &__return_storage_ptr__->m_backend;
  local_8e0 = p_low;
  local_8d8 = p_up;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)local_a68,10.0);
  if (&local_7e8 != &p_delta->m_backend) {
    local_7e8.data._M_elems._0_8_ = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    local_7e8.data._M_elems._8_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    local_7e8.data._M_elems._16_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    local_7e8.data._M_elems._24_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    local_7e8.data._M_elems._32_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    local_7e8.data._M_elems._40_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 10);
    local_7e8.data._M_elems._48_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xc);
    uVar3 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xe);
    local_7e8.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_7e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_7e8.exp = (p_delta->m_backend).exp;
    local_7e8.neg = (p_delta->m_backend).neg;
    local_7e8.fpclass = (p_delta->m_backend).fpclass;
    local_7e8.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            (&local_7e8,(cpp_dec_float<100U,_int,_void> *)local_a68);
  local_838.fpclass = cpp_dec_float_finite;
  local_838.prec_elem = 0x10;
  local_838.data._M_elems[0] = 0;
  local_838.data._M_elems[1] = 0;
  local_838.data._M_elems[2] = 0;
  local_838.data._M_elems[3] = 0;
  local_838.data._M_elems[4] = 0;
  local_838.data._M_elems[5] = 0;
  local_838.data._M_elems[6] = 0;
  local_838.data._M_elems[7] = 0;
  local_838.data._M_elems[8] = 0;
  local_838.data._M_elems[9] = 0;
  local_838.data._M_elems[10] = 0;
  local_838.data._M_elems[0xb] = 0;
  local_838.data._M_elems[0xc] = 0;
  local_838.data._M_elems[0xd] = 0;
  local_838.data._M_elems._56_5_ = 0;
  local_838.data._M_elems[0xf]._1_3_ = 0;
  local_838.exp = 0;
  local_838.neg = false;
  local_a20 = 3.39519326554444e-313;
  local_a68._0_4_ = 0;
  local_a68._4_4_ = 0;
  local_a68._8_4_ = 0;
  local_a68._12_4_ = 0;
  local_a68._16_4_ = 0;
  local_a68._20_4_ = 0;
  local_a68._24_4_ = 0;
  local_a68._28_4_ = 0;
  local_a68._32_4_ = 0;
  local_a68._36_4_ = 0;
  local_a68._40_4_ = 0;
  local_a68._44_4_ = 0;
  local_a68._48_4_ = 0;
  local_a68._52_4_ = 0;
  local_a68._56_5_ = 0;
  local_a68._61_3_ = 0;
  local_a68._64_4_ = 0;
  local_a68[0x44] = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)local_a68,100.0);
  if (&local_838 != &p_delta->m_backend) {
    local_838.data._M_elems._0_8_ = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    local_838.data._M_elems._8_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    local_838.data._M_elems._16_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    local_838.data._M_elems._24_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    local_838.data._M_elems._32_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    local_838.data._M_elems._40_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 10);
    local_838.data._M_elems._48_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xc);
    uVar3 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xe);
    local_838.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_838.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_838.exp = (p_delta->m_backend).exp;
    local_838.neg = (p_delta->m_backend).neg;
    local_838.fpclass = (p_delta->m_backend).fpclass;
    local_838.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            (&local_838,(cpp_dec_float<100U,_int,_void> *)local_a68);
  local_870._0_4_ = cpp_dec_float_finite;
  local_870._4_4_ = 0x10;
  local_8b8._0_4_ = 0;
  local_8b8._4_4_ = 0;
  local_8b8._8_4_ = 0;
  local_8b8._12_4_ = 0;
  local_8b8._16_4_ = 0;
  local_8b8._20_4_ = 0;
  local_8b8._24_4_ = 0;
  local_8b8._28_4_ = 0;
  local_8b8._32_4_ = 0;
  local_8b8._36_4_ = 0;
  local_8b8._40_4_ = 0;
  local_8b8._44_4_ = 0;
  local_8b8._48_4_ = 0;
  local_8b8._52_4_ = 0;
  local_8b8._56_5_ = 0;
  local_8b8._61_3_ = 0;
  local_8b8._64_4_ = 0;
  local_8b8[0x44] = false;
  local_950._0_4_ = cpp_dec_float_finite;
  local_950._4_4_ = 0x10;
  local_998._0_4_ = 0;
  local_998._4_4_ = 0;
  local_998._8_4_ = 0;
  local_998._12_4_ = 0;
  local_998._16_4_ = 0;
  local_998._20_4_ = 0;
  local_998._24_4_ = 0;
  local_998._28_4_ = 0;
  local_998._32_4_ = 0;
  local_998._36_4_ = 0;
  local_998._40_4_ = 0;
  local_998._44_4_ = 0;
  local_998._48_4_ = 0;
  local_998._52_4_ = 0;
  local_998._56_5_ = 0;
  local_998._61_3_ = 0;
  local_998._64_4_ = 0;
  local_998[0x44] = false;
  local_900._0_4_ = cpp_dec_float_finite;
  local_900._4_4_ = 0x10;
  local_948._0_4_ = 0;
  local_948._4_4_ = 0;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0;
  local_948._16_4_ = 0;
  local_948._20_4_ = 0;
  local_948._24_4_ = 0;
  local_948._28_4_ = 0;
  local_948._32_4_ = 0;
  local_948._36_4_ = 0;
  local_948._40_4_ = 0;
  local_948._44_4_ = 0;
  local_948._48_4_ = 0;
  local_948._52_4_ = 0;
  local_948._56_5_ = 0;
  local_948._61_3_ = 0;
  local_948._64_4_ = 0;
  local_948[0x44] = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (local_8f0,0,(type *)0x0);
  if (local_9a0->fullPerturbation == true) {
    uVar3 = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    uVar4 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    uVar5 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    uVar6 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    uVar7 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    uVar8 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 10);
    uVar9 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xe);
    *(undefined8 *)((eps->m_backend).data._M_elems + 0xc) =
         *(undefined8 *)((p_delta->m_backend).data._M_elems + 0xc);
    *(undefined8 *)((eps->m_backend).data._M_elems + 0xe) = uVar9;
    *(undefined8 *)((eps->m_backend).data._M_elems + 8) = uVar7;
    *(undefined8 *)((eps->m_backend).data._M_elems + 10) = uVar8;
    *(undefined8 *)((eps->m_backend).data._M_elems + 4) = uVar5;
    *(undefined8 *)((eps->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(eps->m_backend).data._M_elems = uVar3;
    *(undefined8 *)((eps->m_backend).data._M_elems + 2) = uVar4;
    (eps->m_backend).exp = (p_delta->m_backend).exp;
    (eps->m_backend).neg = (p_delta->m_backend).neg;
    iVar10 = (p_delta->m_backend).prec_elem;
    (eps->m_backend).fpclass = (p_delta->m_backend).fpclass;
    (eps->m_backend).prec_elem = iVar10;
    uVar16 = (int)((ulong)((long)(local_a10->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_a10->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 +
             ~start;
    if (-1 < (int)uVar16) {
      local_8c8 = *(double *)(in_FS_OFFSET + -8);
      local_868._0_8_ = &local_9a0->random;
      uStack_8c0 = 0;
      local_848._8_4_ = DAT_00601010._8_4_;
      local_848._0_8_ = (ulong)DAT_00601010 ^ (ulong)local_8c8;
      local_848._12_4_ = DAT_00601010._12_4_;
      do {
        pUVar17 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(ulong)uVar16;
        pnVar14 = (local_8d8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_948._0_8_ = *(undefined8 *)&pnVar14[(long)pUVar17].m_backend.data;
        local_948._8_8_ = *(undefined8 *)((long)&pnVar14[(long)pUVar17].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x10);
        local_948._16_8_ = *(undefined8 *)puVar1;
        local_948._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x20);
        local_948._32_8_ = *(undefined8 *)puVar1;
        local_948._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x30);
        local_948._48_8_ = *(undefined8 *)puVar1;
        local_678.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_948._56_5_ = local_678.m_backend.data._M_elems._56_5_;
        local_948._61_3_ = local_678.m_backend.data._M_elems[0xf]._1_3_;
        local_948._64_4_ = pnVar14[(long)pUVar17].m_backend.exp;
        local_948[0x44] = pnVar14[(long)pUVar17].m_backend.neg;
        local_678.m_backend.fpclass = pnVar14[(long)pUVar17].m_backend.fpclass;
        local_678.m_backend.prec_elem = pnVar14[(long)pUVar17].m_backend.prec_elem;
        local_900._4_4_ = local_678.m_backend.prec_elem;
        local_900._0_4_ = local_678.m_backend.fpclass;
        pnVar14 = (local_8e0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_998._0_8_ = *(undefined8 *)&pnVar14[(long)pUVar17].m_backend.data;
        local_998._8_8_ = *(undefined8 *)((long)&pnVar14[(long)pUVar17].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x10);
        local_998._16_8_ = *(undefined8 *)puVar1;
        local_998._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x20);
        local_998._32_8_ = *(undefined8 *)puVar1;
        local_998._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x30);
        local_998._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_998._56_5_ = (undefined5)uVar3;
        local_998._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_998._64_4_ = pnVar14[(long)pUVar17].m_backend.exp;
        local_998[0x44] = pnVar14[(long)pUVar17].m_backend.neg;
        local_950 = *(double *)&pnVar14[(long)pUVar17].m_backend.fpclass;
        local_8b8._0_8_ = *(undefined8 *)&local_8d0[(long)pUVar17].m_backend;
        local_8b8._8_8_ = *(undefined8 *)((long)&local_8d0[(long)pUVar17].m_backend + 8);
        local_8b8._16_8_ = *(undefined8 *)((long)(local_8d0 + (long)pUVar17) + 0x10);
        local_8b8._24_8_ = *(undefined8 *)((long)(local_8d0 + (long)pUVar17) + 0x18);
        local_8b8._32_8_ = *(undefined8 *)((long)(local_8d0 + (long)pUVar17) + 0x20);
        local_8b8._40_8_ = *(undefined8 *)((long)(local_8d0 + (long)pUVar17) + 0x28);
        local_8b8._48_8_ = *(undefined8 *)((long)(local_8d0 + (long)pUVar17) + 0x30);
        uVar3 = *(undefined8 *)((long)(local_8d0 + (long)pUVar17) + 0x38);
        local_8b8._56_5_ = (undefined5)uVar3;
        local_8b8._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_8b8._64_4_ = *(undefined4 *)((long)(local_8d0 + (long)pUVar17) + 0x40);
        local_8b8[0x44] = *(bool *)((long)(local_8d0 + (long)pUVar17) + 0x44);
        local_870 = *(double *)((long)(local_8d0 + (long)pUVar17) + 0x48);
        local_678.m_backend.data._M_elems._0_8_ = local_948._0_8_;
        local_678.m_backend.data._M_elems._8_8_ = local_948._8_8_;
        local_678.m_backend.data._M_elems._16_8_ = local_948._16_8_;
        local_678.m_backend.data._M_elems._24_8_ = local_948._24_8_;
        local_678.m_backend.data._M_elems._32_8_ = local_948._32_8_;
        local_678.m_backend.data._M_elems._40_8_ = local_948._40_8_;
        local_678.m_backend.data._M_elems._48_8_ = local_948._48_8_;
        local_678.m_backend.exp = local_948._64_4_;
        local_678.m_backend.neg = local_948[0x44];
        ::soplex::infinity::__tls_init();
        local_858 = &local_8d0[(long)pUVar17].m_backend;
        local_40 = 0x1000000000;
        local_88 = 0;
        uStack_80 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_4b = 0;
        uStack_48 = 0;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_88,local_8c8);
        local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_178.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_178.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_178.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_178.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_178.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_178.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_178.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_178.m_backend.exp = (eps->m_backend).exp;
        local_178.m_backend.neg = (eps->m_backend).neg;
        local_178.m_backend.fpclass = (eps->m_backend).fpclass;
        local_178.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar12 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_678,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_88,&local_178);
        if (bVar12) {
          local_1c8._61_3_ = local_998._61_3_;
          local_1c8._56_5_ = local_998._56_5_;
          local_1c8._48_8_ = local_998._48_8_;
          local_1c8._32_8_ = local_998._32_8_;
          local_1c8._40_8_ = local_998._40_8_;
          local_1c8._16_8_ = local_998._16_8_;
          local_1c8._24_8_ = local_998._24_8_;
          local_1c8._0_8_ = local_998._0_8_;
          local_1c8._8_8_ = local_998._8_8_;
          local_1c8._64_4_ = local_998._64_4_;
          local_1c8[0x44] = local_998[0x44];
          local_1c8._72_8_ = local_950;
          local_218.m_backend.data._M_elems[0xf]._1_3_ = local_948._61_3_;
          local_218.m_backend.data._M_elems._56_5_ = local_948._56_5_;
          local_218.m_backend.data._M_elems[0] = local_948._0_4_;
          local_218.m_backend.data._M_elems[1] = local_948._4_4_;
          local_218.m_backend.data._M_elems[2] = local_948._8_4_;
          local_218.m_backend.data._M_elems[3] = local_948._12_4_;
          local_218.m_backend.data._M_elems[4] = local_948._16_4_;
          local_218.m_backend.data._M_elems[5] = local_948._20_4_;
          local_218.m_backend.data._M_elems[6] = local_948._24_4_;
          local_218.m_backend.data._M_elems[7] = local_948._28_4_;
          local_218.m_backend.data._M_elems[8] = local_948._32_4_;
          local_218.m_backend.data._M_elems[9] = local_948._36_4_;
          local_218.m_backend.data._M_elems[10] = local_948._40_4_;
          local_218.m_backend.data._M_elems[0xb] = local_948._44_4_;
          local_218.m_backend.data._M_elems[0xc] = local_948._48_4_;
          local_218.m_backend.data._M_elems[0xd] = local_948._52_4_;
          local_218.m_backend.exp = local_948._64_4_;
          local_218.m_backend.neg = local_948[0x44];
          local_218.m_backend.fpclass = (fpclass_type)local_900;
          local_218.m_backend.prec_elem = local_900._4_4_;
          local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_268.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_268.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_268.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_268.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_268.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_268.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_268.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_268.m_backend.exp = (eps->m_backend).exp;
          local_268.m_backend.neg = (eps->m_backend).neg;
          local_268.m_backend.fpclass = (eps->m_backend).fpclass;
          local_268.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar12 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_1c8,&local_218,&local_268);
          if (bVar12) {
            local_a20 = 3.39519326554444e-313;
            local_a68._0_4_ = 0;
            local_a68._4_4_ = 0;
            local_a68._8_4_ = 0;
            local_a68._12_4_ = 0;
            local_a68._16_4_ = 0;
            local_a68._20_4_ = 0;
            local_a68._24_4_ = 0;
            local_a68._28_4_ = 0;
            local_a68._32_4_ = 0;
            local_a68._36_4_ = 0;
            local_a68._40_4_ = 0;
            local_a68._44_4_ = 0;
            local_a68._48_4_ = 0;
            local_a68._52_4_ = 0;
            local_a68._56_5_ = 0;
            local_a68._61_3_ = 0;
            local_a68._64_4_ = 0;
            local_a68[0x44] = false;
            pcVar15 = (cpp_dec_float<100U,_int,_void> *)local_8b8;
            if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_a68 != eps) {
              local_a68._48_8_ = local_8b8._48_8_;
              local_a68._56_5_ = local_8b8._56_5_;
              local_a68._61_3_ = local_8b8._61_3_;
              local_a68._32_8_ = local_8b8._32_8_;
              local_a68._40_8_ = local_8b8._40_8_;
              local_a68._16_8_ = local_8b8._16_8_;
              local_a68._24_8_ = local_8b8._24_8_;
              local_a68._0_8_ = local_8b8._0_8_;
              local_a68._8_8_ = local_8b8._8_8_;
              local_a68._64_4_ = local_8b8._64_4_;
              local_a68[0x44] = local_8b8[0x44];
              local_a20 = local_870;
              pcVar15 = &eps->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      ((cpp_dec_float<100U,_int,_void> *)local_a68,pcVar15);
            if ((((fpclass_type)local_900 != cpp_dec_float_NaN) &&
                (local_a20._0_4_ != cpp_dec_float_NaN)) &&
               ((iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    ((cpp_dec_float<100U,_int,_void> *)local_948,
                                     (cpp_dec_float<100U,_int,_void> *)local_a68), iVar13 < 1 &&
                (stat[(long)pUVar17] * local_9a0->theRep < 0)))) {
              local_a10 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             extract_double(&local_7e8);
              local_9b8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          extract_double(&local_838);
              RVar2 = Random::next_random((Random *)local_868._0_8_);
              local_a08.fpclass = cpp_dec_float_finite;
              local_a08.prec_elem = 0x10;
              local_a08.data._M_elems[0] = 0;
              local_a08.data._M_elems[1] = 0;
              local_a08.data._M_elems[2] = 0;
              local_a08.data._M_elems[3] = 0;
              local_a08.data._M_elems[4] = 0;
              local_a08.data._M_elems[5] = 0;
              local_a08.data._M_elems[6] = 0;
              local_a08.data._M_elems[7] = 0;
              local_a08.data._M_elems[8] = 0;
              local_a08.data._M_elems[9] = 0;
              local_a08.data._M_elems[10] = 0;
              local_a08.data._M_elems[0xb] = 0;
              local_a08.data._M_elems[0xc] = 0;
              local_a08.data._M_elems[0xd] = 0;
              local_a08.data._M_elems._56_5_ = 0;
              local_a08.data._M_elems[0xf]._1_3_ = 0;
              local_a08.exp = 0;
              local_a08.neg = false;
              local_a20 = 3.39519326554444e-313;
              local_a68._0_4_ = 0;
              local_a68._4_4_ = 0;
              local_a68._8_4_ = 0;
              local_a68._12_4_ = 0;
              local_a68._16_4_ = 0;
              local_a68._20_4_ = 0;
              local_a68._24_4_ = 0;
              local_a68._28_4_ = 0;
              local_a68._32_4_ = 0;
              local_a68._36_4_ = 0;
              local_a68._40_4_ = 0;
              local_a68._44_4_ = 0;
              local_a68._48_4_ = 0;
              local_a68._52_4_ = 0;
              local_a68._56_5_ = 0;
              local_a68._61_3_ = 0;
              local_a68._64_4_ = 0;
              local_a68[0x44] = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_a68,
                         RVar2 * local_9b8 + (1.0 - RVar2) * (double)local_a10);
              if (&local_a08 != local_858) {
                local_a08.data._M_elems._0_8_ =
                     *(undefined8 *)
                      (((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems;
                local_a08.data._M_elems._8_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      8);
                local_a08.data._M_elems._16_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x10);
                local_a08.data._M_elems._24_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x18);
                local_a08.data._M_elems._32_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x20);
                local_a08.data._M_elems._40_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x28);
                local_a08.data._M_elems._48_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x30);
                uVar3 = *(undefined8 *)
                         ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data).
                                _M_elems + 0x38);
                local_a08.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_a08.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_a08.exp = local_858->exp;
                local_a08.neg = local_858->neg;
                local_a08.fpclass = local_858->fpclass;
                local_a08.prec_elem = local_858->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_a08,(cpp_dec_float<100U,_int,_void> *)local_a68);
              pnVar14 = (local_8d8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x30);
              *(undefined8 *)puVar1 = local_a08.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(local_a08.data._M_elems[0xf]._1_3_,local_a08.data._M_elems._56_5_);
              puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x20);
              *(undefined8 *)puVar1 = local_a08.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._40_8_;
              puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = local_a08.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._24_8_;
              *(undefined8 *)&pnVar14[(long)pUVar17].m_backend.data = local_a08.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar14[(long)pUVar17].m_backend.data + 8) =
                   local_a08.data._M_elems._8_8_;
              pnVar14[(long)pUVar17].m_backend.exp = local_a08.exp;
              pnVar14[(long)pUVar17].m_backend.neg = local_a08.neg;
              pnVar14[(long)pUVar17].m_backend.fpclass = local_a08.fpclass;
              pnVar14[(long)pUVar17].m_backend.prec_elem = local_a08.prec_elem;
              pnVar14 = (local_8d8->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pUVar17;
              local_a20 = 3.39519326554444e-313;
              local_a68._0_4_ = 0;
              local_a68._4_4_ = 0;
              local_a68._8_4_ = 0;
              local_a68._12_4_ = 0;
              local_a68._16_4_ = 0;
              local_a68._20_4_ = 0;
              local_a68._24_4_ = 0;
              local_a68._28_4_ = 0;
              local_a68._32_4_ = 0;
              local_a68._36_4_ = 0;
              local_a68._40_4_ = 0;
              local_a68._44_4_ = 0;
              local_a68._48_4_ = 0;
              local_a68._52_4_ = 0;
              local_a68._56_5_ = 0;
              local_a68._61_3_ = 0;
              local_a68._64_4_ = 0;
              local_a68[0x44] = false;
              if ((pointer)local_a68 != pnVar14) {
                local_a68._0_8_ = *(undefined8 *)&(pnVar14->m_backend).data;
                local_a68._8_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 8);
                local_a68._16_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x10);
                local_a68._24_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x18);
                local_a68._32_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x20);
                local_a68._40_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x28);
                local_a68._48_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x30);
                uVar3 = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x38);
                local_a68._56_5_ = (undefined5)uVar3;
                local_a68._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_a68._64_4_ = (pnVar14->m_backend).exp;
                local_a68[0x44] = (pnVar14->m_backend).neg;
                local_a20 = *(double *)&(pnVar14->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a68,
                         (cpp_dec_float<100U,_int,_void> *)local_948);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_8f0,(cpp_dec_float<100U,_int,_void> *)local_a68);
            }
          }
        }
        bVar12 = local_998[0x44];
        uVar11 = local_998._64_4_;
        uStack_720 = CONCAT35(local_998._61_3_,local_998._56_5_);
        local_728[0] = local_998._48_4_;
        local_728[1] = local_998._52_4_;
        local_738[0] = local_998._32_4_;
        local_738[1] = local_998._36_4_;
        auStack_730[0] = local_998._40_4_;
        auStack_730[1] = local_998._44_4_;
        local_748[0] = local_998._16_4_;
        local_748[1] = local_998._20_4_;
        auStack_740[0] = local_998._24_4_;
        auStack_740[1] = local_998._28_4_;
        local_758[0] = local_998._0_4_;
        local_758[1] = local_998._4_4_;
        auStack_750[0] = local_998._8_4_;
        auStack_750[1] = local_998._12_4_;
        local_9b8 = local_950;
        uStack_9b0 = 0;
        local_a10 = pUVar17;
        ::soplex::infinity::__tls_init();
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_d8,(double)local_848._0_8_);
        local_6c8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_6c8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_6c8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_6c8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_6c8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_6c8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_6c8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_6c8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_6c8.exp = (eps->m_backend).exp;
        local_6c8.neg = (eps->m_backend).neg;
        local_6c8.fpclass = (eps->m_backend).fpclass;
        local_6c8.prec_elem = (eps->m_backend).prec_elem;
        local_a68._48_4_ = local_728[0];
        local_a68._52_4_ = local_728[1];
        local_a68._56_5_ = (undefined5)uStack_720;
        local_a68._61_3_ = (undefined3)((ulong)uStack_720 >> 0x28);
        local_a68._32_4_ = local_738[0];
        local_a68._36_4_ = local_738[1];
        local_a68._40_4_ = auStack_730[0];
        local_a68._44_4_ = auStack_730[1];
        local_a68._16_4_ = local_748[0];
        local_a68._20_4_ = local_748[1];
        local_a68._24_4_ = auStack_740[0];
        local_a68._28_4_ = auStack_740[1];
        local_a68._0_4_ = local_758[0];
        local_a68._4_4_ = local_758[1];
        local_a68._8_4_ = auStack_750[0];
        local_a68._12_4_ = auStack_750[1];
        local_a68._64_4_ = uVar11;
        local_a68[0x44] = bVar12;
        local_a20 = local_9b8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_a68,&local_d8);
        pUVar18 = local_a10;
        if (((local_a20._0_4_ != cpp_dec_float_NaN) && (local_6c8.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_a68,&local_6c8),
           pUVar18 = local_a10, 0 < iVar13)) {
          local_2b8._61_3_ = local_998._61_3_;
          local_2b8._56_5_ = local_998._56_5_;
          local_2b8._48_8_ = local_998._48_8_;
          local_2b8._32_8_ = local_998._32_8_;
          local_2b8._40_8_ = local_998._40_8_;
          local_2b8._16_8_ = local_998._16_8_;
          local_2b8._24_8_ = local_998._24_8_;
          local_2b8._0_8_ = local_998._0_8_;
          local_2b8._8_8_ = local_998._8_8_;
          local_2b8._64_4_ = local_998._64_4_;
          local_2b8[0x44] = local_998[0x44];
          local_2b8._72_8_ = local_950;
          local_308.m_backend.data._M_elems[0xf]._1_3_ = local_948._61_3_;
          local_308.m_backend.data._M_elems._56_5_ = local_948._56_5_;
          local_308.m_backend.data._M_elems[0] = local_948._0_4_;
          local_308.m_backend.data._M_elems[1] = local_948._4_4_;
          local_308.m_backend.data._M_elems[2] = local_948._8_4_;
          local_308.m_backend.data._M_elems[3] = local_948._12_4_;
          local_308.m_backend.data._M_elems[4] = local_948._16_4_;
          local_308.m_backend.data._M_elems[5] = local_948._20_4_;
          local_308.m_backend.data._M_elems[6] = local_948._24_4_;
          local_308.m_backend.data._M_elems[7] = local_948._28_4_;
          local_308.m_backend.data._M_elems[8] = local_948._32_4_;
          local_308.m_backend.data._M_elems[9] = local_948._36_4_;
          local_308.m_backend.data._M_elems[10] = local_948._40_4_;
          local_308.m_backend.data._M_elems[0xb] = local_948._44_4_;
          local_308.m_backend.data._M_elems[0xc] = local_948._48_4_;
          local_308.m_backend.data._M_elems[0xd] = local_948._52_4_;
          local_308.m_backend.exp = local_948._64_4_;
          local_308.m_backend.neg = local_948[0x44];
          local_308.m_backend.fpclass = (fpclass_type)local_900;
          local_308.m_backend.prec_elem = local_900._4_4_;
          local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_358.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_358.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_358.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_358.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_358.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_358.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_358.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_358.m_backend.exp = (eps->m_backend).exp;
          local_358.m_backend.neg = (eps->m_backend).neg;
          local_358.m_backend.fpclass = (eps->m_backend).fpclass;
          local_358.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar12 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_2b8,&local_308,&local_358);
          if (bVar12) {
            local_a20 = 3.39519326554444e-313;
            local_a68._0_4_ = 0;
            local_a68._4_4_ = 0;
            local_a68._8_4_ = 0;
            local_a68._12_4_ = 0;
            local_a68._16_4_ = 0;
            local_a68._20_4_ = 0;
            local_a68._24_4_ = 0;
            local_a68._28_4_ = 0;
            local_a68._32_4_ = 0;
            local_a68._36_4_ = 0;
            local_a68._40_4_ = 0;
            local_a68._44_4_ = 0;
            local_a68._48_4_ = 0;
            local_a68._52_4_ = 0;
            local_a68._56_5_ = 0;
            local_a68._61_3_ = 0;
            local_a68._64_4_ = 0;
            local_a68[0x44] = false;
            if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_a68 == eps) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a68,
                         (cpp_dec_float<100U,_int,_void> *)local_8b8);
              if (local_a68._0_4_ != 0 || local_a20._0_4_ != cpp_dec_float_finite) {
                local_a68[0x44] = local_a68[0x44] ^ 1;
              }
            }
            else {
              local_a68._48_8_ = local_8b8._48_8_;
              local_a68._56_5_ = local_8b8._56_5_;
              local_a68._61_3_ = local_8b8._61_3_;
              local_a68._32_8_ = local_8b8._32_8_;
              local_a68._40_8_ = local_8b8._40_8_;
              local_a68._16_8_ = local_8b8._16_8_;
              local_a68._24_8_ = local_8b8._24_8_;
              local_a68._0_8_ = local_8b8._0_8_;
              local_a68._8_8_ = local_8b8._8_8_;
              local_a68._64_4_ = local_8b8._64_4_;
              local_a68[0x44] = local_8b8[0x44];
              local_a20 = local_870;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a68,&eps->m_backend);
            }
            if ((((fpclass_type)local_950 != cpp_dec_float_NaN) &&
                (local_a20._0_4_ != cpp_dec_float_NaN)) &&
               ((iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    ((cpp_dec_float<100U,_int,_void> *)local_998,
                                     (cpp_dec_float<100U,_int,_void> *)local_a68), -1 < iVar13 &&
                (stat[(long)pUVar18] * local_9a0->theRep < 0)))) {
              local_9b8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          extract_double(&local_7e8);
              local_8e8 = (Random *)
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          extract_double(&local_838);
              RVar2 = Random::next_random((Random *)local_868._0_8_);
              local_a08.fpclass = cpp_dec_float_finite;
              local_a08.prec_elem = 0x10;
              local_a08.data._M_elems[0] = 0;
              local_a08.data._M_elems[1] = 0;
              local_a08.data._M_elems[2] = 0;
              local_a08.data._M_elems[3] = 0;
              local_a08.data._M_elems[4] = 0;
              local_a08.data._M_elems[5] = 0;
              local_a08.data._M_elems[6] = 0;
              local_a08.data._M_elems[7] = 0;
              local_a08.data._M_elems[8] = 0;
              local_a08.data._M_elems[9] = 0;
              local_a08.data._M_elems[10] = 0;
              local_a08.data._M_elems[0xb] = 0;
              local_a08.data._M_elems[0xc] = 0;
              local_a08.data._M_elems[0xd] = 0;
              local_a08.data._M_elems._56_5_ = 0;
              local_a08.data._M_elems[0xf]._1_3_ = 0;
              local_a08.exp = 0;
              local_a08.neg = false;
              local_a20 = 3.39519326554444e-313;
              local_a68._0_4_ = 0;
              local_a68._4_4_ = 0;
              local_a68._8_4_ = 0;
              local_a68._12_4_ = 0;
              local_a68._16_4_ = 0;
              local_a68._20_4_ = 0;
              local_a68._24_4_ = 0;
              local_a68._28_4_ = 0;
              local_a68._32_4_ = 0;
              local_a68._36_4_ = 0;
              local_a68._40_4_ = 0;
              local_a68._44_4_ = 0;
              local_a68._48_4_ = 0;
              local_a68._52_4_ = 0;
              local_a68._56_5_ = 0;
              local_a68._61_3_ = 0;
              local_a68._64_4_ = 0;
              local_a68[0x44] = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)local_a68,
                         RVar2 * (double)local_8e8 + (1.0 - RVar2) * local_9b8);
              if (&local_a08 != local_858) {
                local_a08.data._M_elems._0_8_ =
                     *(undefined8 *)
                      (((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems;
                local_a08.data._M_elems._8_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      8);
                local_a08.data._M_elems._16_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x10);
                local_a08.data._M_elems._24_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x18);
                local_a08.data._M_elems._32_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x20);
                local_a08.data._M_elems._40_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x28);
                local_a08.data._M_elems._48_8_ =
                     *(undefined8 *)
                      ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data)._M_elems +
                      0x30);
                uVar3 = *(undefined8 *)
                         ((long)(((cpp_dec_float<100U,_int,_void> *)&local_858->data)->data).
                                _M_elems + 0x38);
                local_a08.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_a08.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_a08.exp = local_858->exp;
                local_a08.neg = local_858->neg;
                local_a08.fpclass = local_858->fpclass;
                local_a08.prec_elem = local_858->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_a08,(cpp_dec_float<100U,_int,_void> *)local_a68);
              pnVar14 = (local_8e0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x30);
              *(undefined8 *)puVar1 = local_a08.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(local_a08.data._M_elems[0xf]._1_3_,local_a08.data._M_elems._56_5_);
              puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x20);
              *(undefined8 *)puVar1 = local_a08.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._40_8_;
              puVar1 = (uint *)((long)&pnVar14[(long)pUVar17].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = local_a08.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._24_8_;
              *(undefined8 *)&pnVar14[(long)pUVar17].m_backend.data = local_a08.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar14[(long)pUVar17].m_backend.data + 8) =
                   local_a08.data._M_elems._8_8_;
              pnVar14[(long)pUVar17].m_backend.exp = local_a08.exp;
              pnVar14[(long)pUVar17].m_backend.neg = local_a08.neg;
              pnVar14[(long)pUVar17].m_backend.fpclass = local_a08.fpclass;
              pnVar14[(long)pUVar17].m_backend.prec_elem = local_a08.prec_elem;
              pnVar14 = (local_8e0->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pUVar17;
              local_a20 = 3.39519326554444e-313;
              local_a68._0_4_ = 0;
              local_a68._4_4_ = 0;
              local_a68._8_4_ = 0;
              local_a68._12_4_ = 0;
              local_a68._16_4_ = 0;
              local_a68._20_4_ = 0;
              local_a68._24_4_ = 0;
              local_a68._28_4_ = 0;
              local_a68._32_4_ = 0;
              local_a68._36_4_ = 0;
              local_a68._40_4_ = 0;
              local_a68._44_4_ = 0;
              local_a68._48_4_ = 0;
              local_a68._52_4_ = 0;
              local_a68._56_5_ = 0;
              local_a68._61_3_ = 0;
              local_a68._64_4_ = 0;
              local_a68[0x44] = false;
              if ((pointer)local_a68 != pnVar14) {
                local_a68._0_8_ = *(undefined8 *)&(pnVar14->m_backend).data;
                local_a68._8_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 8);
                local_a68._16_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x10);
                local_a68._24_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x18);
                local_a68._32_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x20);
                local_a68._40_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x28);
                local_a68._48_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x30);
                uVar3 = *(undefined8 *)((long)&(pnVar14->m_backend).data + 0x38);
                local_a68._56_5_ = (undefined5)uVar3;
                local_a68._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_a68._64_4_ = (pnVar14->m_backend).exp;
                local_a68[0x44] = (pnVar14->m_backend).neg;
                local_a20 = *(double *)&(pnVar14->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_a68,
                         (cpp_dec_float<100U,_int,_void> *)local_998);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (local_8f0,(cpp_dec_float<100U,_int,_void> *)local_a68);
            }
          }
        }
        uVar16 = (int)pUVar18 - incr;
      } while (-1 < (int)uVar16);
    }
  }
  else {
    uVar16 = ~start + (local_a10->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar16) {
      pnVar14 = (local_a10->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_858 = *(cpp_dec_float<100U,_int,_void> **)(in_FS_OFFSET + -8);
      local_8e8 = &local_9a0->random;
      uStack_850 = 0;
      local_868._8_4_ = DAT_00601010._8_4_;
      local_868._0_8_ = (ulong)DAT_00601010 ^ (ulong)local_858;
      local_868._12_4_ = DAT_00601010._12_4_;
      do {
        dVar19 = (double)(long)(local_a10->thedelta).super_IdxSet.idx[uVar16];
        local_8b8._0_8_ = *(undefined8 *)&pnVar14[(long)dVar19].m_backend.data;
        local_8b8._8_8_ = *(undefined8 *)((long)&pnVar14[(long)dVar19].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar14[(long)dVar19].m_backend.data + 0x10);
        local_8b8._16_8_ = *(undefined8 *)puVar1;
        local_8b8._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar14[(long)dVar19].m_backend.data + 0x20);
        local_8b8._32_8_ = *(undefined8 *)puVar1;
        local_8b8._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar14[(long)dVar19].m_backend.data + 0x30);
        local_8b8._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_8b8._56_5_ = (undefined5)uVar3;
        local_8b8._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_8b8._64_4_ = pnVar14[(long)dVar19].m_backend.exp;
        local_8b8[0x44] = pnVar14[(long)dVar19].m_backend.neg;
        local_870._0_4_ = pnVar14[(long)dVar19].m_backend.fpclass;
        local_870._4_4_ = pnVar14[(long)dVar19].m_backend.prec_elem;
        pnVar20 = (local_8d8->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_948._0_8_ = *(undefined8 *)&pnVar20[(long)dVar19].m_backend.data;
        local_948._8_8_ = *(undefined8 *)((long)&pnVar20[(long)dVar19].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x10);
        local_948._16_8_ = *(undefined8 *)puVar1;
        local_948._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x20);
        local_948._32_8_ = *(undefined8 *)puVar1;
        local_948._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x30);
        local_948._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_948._56_5_ = (undefined5)uVar3;
        local_948._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_948._64_4_ = pnVar20[(long)dVar19].m_backend.exp;
        local_948[0x44] = pnVar20[(long)dVar19].m_backend.neg;
        local_900 = *(double *)&pnVar20[(long)dVar19].m_backend.fpclass;
        pnVar20 = (local_8e0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_998._0_8_ = *(undefined8 *)&pnVar20[(long)dVar19].m_backend.data;
        local_998._8_8_ = *(undefined8 *)((long)&pnVar20[(long)dVar19].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x10);
        local_998._16_8_ = *(undefined8 *)puVar1;
        local_998._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x20);
        local_998._32_8_ = *(undefined8 *)puVar1;
        local_998._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x30);
        local_998._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_998._56_5_ = (undefined5)uVar3;
        local_998._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_998._64_4_ = pnVar20[(long)dVar19].m_backend.exp;
        local_998[0x44] = pnVar20[(long)dVar19].m_backend.neg;
        local_950 = *(double *)&pnVar20[(long)dVar19].m_backend.fpclass;
        if ((((fpclass_type)local_870 == cpp_dec_float_NaN) ||
            ((eps->m_backend).fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_8b8,&eps->m_backend),
           iVar13 < 1)) {
          local_a68._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_a68._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_a68._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_a68._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_a68._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_a68._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_a68._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          uVar3 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_a68._56_5_ = (undefined5)uVar3;
          local_a68._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_a68._64_4_ = (eps->m_backend).exp;
          local_a68[0x44] = (eps->m_backend).neg;
          local_a20 = *(double *)&(eps->m_backend).fpclass;
          if (local_a68._0_4_ != 0 || SUB84(local_a20,0) != 0) {
            local_a68[0x44] = local_a68[0x44] ^ 1;
          }
          if (((SUB84(local_a20,0) != 2) && ((fpclass_type)local_870 != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_8b8,
                                  (cpp_dec_float<100U,_int,_void> *)local_a68),
             uVar11 = local_998._64_4_, iVar13 < 0)) {
            uStack_760 = CONCAT35(local_998._61_3_,local_998._56_5_);
            local_768[0] = local_998._48_4_;
            local_768[1] = local_998._52_4_;
            local_778[0] = local_998._32_4_;
            local_778[1] = local_998._36_4_;
            auStack_770[0] = local_998._40_4_;
            auStack_770[1] = local_998._44_4_;
            local_788[0] = local_998._16_4_;
            local_788[1] = local_998._20_4_;
            auStack_780[0] = local_998._24_4_;
            auStack_780[1] = local_998._28_4_;
            local_798[0] = local_998._0_4_;
            local_798[1] = local_998._4_4_;
            auStack_790[0] = local_998._8_4_;
            auStack_790[1] = local_998._12_4_;
            local_8c8 = (double)CONCAT71(local_8c8._1_7_,local_998[0x44]);
            local_848._8_8_ = 0;
            local_848._0_8_ = local_950;
            local_9b8 = dVar19;
            ::soplex::infinity::__tls_init();
            local_538.fpclass = cpp_dec_float_finite;
            local_538.prec_elem = 0x10;
            local_538.data._M_elems[0] = 0;
            local_538.data._M_elems[1] = 0;
            local_538.data._M_elems[2] = 0;
            local_538.data._M_elems[3] = 0;
            local_538.data._M_elems[4] = 0;
            local_538.data._M_elems[5] = 0;
            local_538.data._M_elems[6] = 0;
            local_538.data._M_elems[7] = 0;
            local_538.data._M_elems[8] = 0;
            local_538.data._M_elems[9] = 0;
            local_538.data._M_elems[10] = 0;
            local_538.data._M_elems[0xb] = 0;
            local_538.data._M_elems[0xc] = 0;
            local_538.data._M_elems[0xd] = 0;
            local_538.data._M_elems._56_5_ = 0;
            local_538.data._M_elems[0xf]._1_3_ = 0;
            local_538.exp = 0;
            local_538.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_538,(double)local_868._0_8_);
            local_718.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_718.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_718.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_718.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_718.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_718.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
            local_718.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
            local_718.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
            local_718.exp = (eps->m_backend).exp;
            local_718.neg = (eps->m_backend).neg;
            local_718.fpclass = (eps->m_backend).fpclass;
            local_718.prec_elem = (eps->m_backend).prec_elem;
            local_a68._48_4_ = local_768[0];
            local_a68._52_4_ = local_768[1];
            local_a68._56_5_ = (undefined5)uStack_760;
            local_a68._61_3_ = (undefined3)((ulong)uStack_760 >> 0x28);
            local_a68._32_4_ = local_778[0];
            local_a68._36_4_ = local_778[1];
            local_a68._40_4_ = auStack_770[0];
            local_a68._44_4_ = auStack_770[1];
            local_a68._16_4_ = local_788[0];
            local_a68._20_4_ = local_788[1];
            local_a68._24_4_ = auStack_780[0];
            local_a68._28_4_ = auStack_780[1];
            local_a68._0_4_ = local_798[0];
            local_a68._4_4_ = local_798[1];
            local_a68._8_4_ = auStack_790[0];
            local_a68._12_4_ = auStack_790[1];
            local_a68._64_4_ = uVar11;
            local_a68[0x44] = local_8c8._0_1_;
            local_a20 = (double)local_848._0_8_;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_a68,&local_538);
            if (((local_a20._0_4_ != cpp_dec_float_NaN) && (local_718.fpclass != cpp_dec_float_NaN))
               && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                      ((cpp_dec_float<100U,_int,_void> *)local_a68,&local_718),
                  0 < iVar13)) {
              local_588._61_3_ = local_998._61_3_;
              local_588._56_5_ = local_998._56_5_;
              local_588._48_8_ = local_998._48_8_;
              local_588._32_8_ = local_998._32_8_;
              local_588._40_8_ = local_998._40_8_;
              local_588._16_8_ = local_998._16_8_;
              local_588._24_8_ = local_998._24_8_;
              local_588._0_8_ = local_998._0_8_;
              local_588._8_8_ = local_998._8_8_;
              local_588._64_4_ = local_998._64_4_;
              local_588[0x44] = local_998[0x44];
              local_588._72_8_ = local_950;
              local_5d8._61_3_ = local_948._61_3_;
              local_5d8._56_5_ = local_948._56_5_;
              local_5d8._0_8_ = local_948._0_8_;
              local_5d8._8_8_ = local_948._8_8_;
              local_5d8._16_8_ = local_948._16_8_;
              local_5d8._24_8_ = local_948._24_8_;
              local_5d8._32_8_ = local_948._32_8_;
              local_5d8._40_8_ = local_948._40_8_;
              local_5d8._48_8_ = local_948._48_8_;
              local_5d8._64_4_ = local_948._64_4_;
              local_5d8[0x44] = local_948[0x44];
              local_5d8._72_8_ = local_900;
              local_628.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(eps->m_backend).data._M_elems;
              local_628.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_628.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_628.m_backend.data._M_elems._24_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_628.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_628.m_backend.data._M_elems._40_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 10);
              local_628.m_backend.data._M_elems._48_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
              local_628.m_backend.data._M_elems._56_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
              local_628.m_backend.exp = (eps->m_backend).exp;
              local_628.m_backend.neg = (eps->m_backend).neg;
              local_628.m_backend.fpclass = (eps->m_backend).fpclass;
              local_628.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar12 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_588,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_5d8,&local_628);
              if (bVar12) {
                local_a20 = 3.39519326554444e-313;
                local_a68._0_4_ = 0;
                local_a68._4_4_ = 0;
                local_a68._8_4_ = 0;
                local_a68._12_4_ = 0;
                local_a68._16_4_ = 0;
                local_a68._20_4_ = 0;
                local_a68._24_4_ = 0;
                local_a68._28_4_ = 0;
                local_a68._32_4_ = 0;
                local_a68._36_4_ = 0;
                local_a68._40_4_ = 0;
                local_a68._44_4_ = 0;
                local_a68._48_4_ = 0;
                local_a68._52_4_ = 0;
                local_a68._56_5_ = 0;
                local_a68._61_3_ = 0;
                local_a68._64_4_ = 0;
                local_a68[0x44] = false;
                pcVar15 = (cpp_dec_float<100U,_int,_void> *)local_998;
                if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_a68 != eps) {
                  local_a68._48_8_ = local_998._48_8_;
                  local_a68._56_5_ = local_998._56_5_;
                  local_a68._61_3_ = local_998._61_3_;
                  local_a68._32_8_ = local_998._32_8_;
                  local_a68._40_8_ = local_998._40_8_;
                  local_a68._16_8_ = local_998._16_8_;
                  local_a68._24_8_ = local_998._24_8_;
                  local_a68._0_8_ = local_998._0_8_;
                  local_a68._8_8_ = local_998._8_8_;
                  local_a68._64_4_ = local_998._64_4_;
                  local_a68[0x44] = local_998[0x44];
                  local_a20 = local_950;
                  pcVar15 = &eps->m_backend;
                }
                this_00 = &local_8d0[(long)local_9b8].m_backend;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          ((cpp_dec_float<100U,_int,_void> *)local_a68,pcVar15);
                if ((((this_00->fpclass != cpp_dec_float_NaN) &&
                     (local_a20._0_4_ != cpp_dec_float_NaN)) &&
                    (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              compare(this_00,(cpp_dec_float<100U,_int,_void> *)local_a68),
                    iVar13 < 1)) && (stat[(long)local_9b8] * local_9a0->theRep < 0)) {
                  local_9b8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              extract_double(&local_7e8);
                  local_8c8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              extract_double(&local_838);
                  RVar2 = Random::next_random(local_8e8);
                  local_a08.fpclass = cpp_dec_float_finite;
                  local_a08.prec_elem = 0x10;
                  local_a08.data._M_elems[0] = 0;
                  local_a08.data._M_elems[1] = 0;
                  local_a08.data._M_elems[2] = 0;
                  local_a08.data._M_elems[3] = 0;
                  local_a08.data._M_elems[4] = 0;
                  local_a08.data._M_elems[5] = 0;
                  local_a08.data._M_elems[6] = 0;
                  local_a08.data._M_elems[7] = 0;
                  local_a08.data._M_elems[8] = 0;
                  local_a08.data._M_elems[9] = 0;
                  local_a08.data._M_elems[10] = 0;
                  local_a08.data._M_elems[0xb] = 0;
                  local_a08.data._M_elems[0xc] = 0;
                  local_a08.data._M_elems[0xd] = 0;
                  local_a08.data._M_elems._56_5_ = 0;
                  local_a08.data._M_elems[0xf]._1_3_ = 0;
                  local_a08.exp = 0;
                  local_a08.neg = false;
                  local_a20 = 3.39519326554444e-313;
                  local_a68._0_4_ = 0;
                  local_a68._4_4_ = 0;
                  local_a68._8_4_ = 0;
                  local_a68._12_4_ = 0;
                  local_a68._16_4_ = 0;
                  local_a68._20_4_ = 0;
                  local_a68._24_4_ = 0;
                  local_a68._28_4_ = 0;
                  local_a68._32_4_ = 0;
                  local_a68._36_4_ = 0;
                  local_a68._40_4_ = 0;
                  local_a68._44_4_ = 0;
                  local_a68._48_4_ = 0;
                  local_a68._52_4_ = 0;
                  local_a68._56_5_ = 0;
                  local_a68._61_3_ = 0;
                  local_a68._64_4_ = 0;
                  local_a68[0x44] = false;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)local_a68,
                             RVar2 * local_8c8 + (1.0 - RVar2) * local_9b8);
                  if (&local_a08 != this_00) {
                    local_a08.data._M_elems._0_8_ = *(undefined8 *)(this_00->data)._M_elems;
                    local_a08.data._M_elems._8_8_ = *(undefined8 *)((this_00->data)._M_elems + 2);
                    local_a08.data._M_elems._16_8_ = *(undefined8 *)((this_00->data)._M_elems + 4);
                    local_a08.data._M_elems._24_8_ = *(undefined8 *)((this_00->data)._M_elems + 6);
                    local_a08.data._M_elems._32_8_ = *(undefined8 *)((this_00->data)._M_elems + 8);
                    local_a08.data._M_elems._40_8_ = *(undefined8 *)((this_00->data)._M_elems + 10);
                    local_a08.data._M_elems._48_8_ = *(undefined8 *)((this_00->data)._M_elems + 0xc)
                    ;
                    uVar3 = *(undefined8 *)((this_00->data)._M_elems + 0xe);
                    local_a08.data._M_elems._56_5_ = SUB85(uVar3,0);
                    local_a08.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                    local_a08.exp = this_00->exp;
                    local_a08.neg = this_00->neg;
                    local_a08.fpclass = this_00->fpclass;
                    local_a08.prec_elem = this_00->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (&local_a08,(cpp_dec_float<100U,_int,_void> *)local_a68);
                  pnVar20 = (local_8e0->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x30);
                  *(undefined8 *)puVar1 = local_a08.data._M_elems._48_8_;
                  *(ulong *)(puVar1 + 2) =
                       CONCAT35(local_a08.data._M_elems[0xf]._1_3_,local_a08.data._M_elems._56_5_);
                  puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x20);
                  *(undefined8 *)puVar1 = local_a08.data._M_elems._32_8_;
                  *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._40_8_;
                  puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x10);
                  *(undefined8 *)puVar1 = local_a08.data._M_elems._16_8_;
                  *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._24_8_;
                  *(undefined8 *)&pnVar20[(long)dVar19].m_backend.data =
                       local_a08.data._M_elems._0_8_;
                  *(undefined8 *)((long)&pnVar20[(long)dVar19].m_backend.data + 8) =
                       local_a08.data._M_elems._8_8_;
                  pnVar20[(long)dVar19].m_backend.exp = local_a08.exp;
                  pnVar20[(long)dVar19].m_backend.neg = local_a08.neg;
                  pnVar20[(long)dVar19].m_backend.fpclass = local_a08.fpclass;
                  pnVar20[(long)dVar19].m_backend.prec_elem = local_a08.prec_elem;
                  pnVar20 = (local_8e0->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)dVar19;
                  local_a20 = 3.39519326554444e-313;
                  local_a68._0_4_ = 0;
                  local_a68._4_4_ = 0;
                  local_a68._8_4_ = 0;
                  local_a68._12_4_ = 0;
                  local_a68._16_4_ = 0;
                  local_a68._20_4_ = 0;
                  local_a68._24_4_ = 0;
                  local_a68._28_4_ = 0;
                  local_a68._32_4_ = 0;
                  local_a68._36_4_ = 0;
                  local_a68._40_4_ = 0;
                  local_a68._44_4_ = 0;
                  local_a68._48_4_ = 0;
                  local_a68._52_4_ = 0;
                  local_a68._56_5_ = 0;
                  local_a68._61_3_ = 0;
                  local_a68._64_4_ = 0;
                  local_a68[0x44] = false;
                  if ((pointer)local_a68 != pnVar20) {
                    local_a68._0_8_ = *(undefined8 *)&(pnVar20->m_backend).data;
                    local_a68._8_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 8);
                    local_a68._16_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x10);
                    local_a68._24_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x18);
                    local_a68._32_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x20);
                    local_a68._40_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x28);
                    local_a68._48_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x30);
                    uVar3 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x38);
                    local_a68._56_5_ = (undefined5)uVar3;
                    local_a68._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                    local_a68._64_4_ = (pnVar20->m_backend).exp;
                    local_a68[0x44] = (pnVar20->m_backend).neg;
                    local_a20 = *(double *)&(pnVar20->m_backend).fpclass;
                  }
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            ((cpp_dec_float<100U,_int,_void> *)local_a68,
                             (cpp_dec_float<100U,_int,_void> *)local_998);
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                            (local_8f0,(cpp_dec_float<100U,_int,_void> *)local_a68);
                }
              }
            }
          }
        }
        else {
          local_3a8._61_3_ = local_948._61_3_;
          local_3a8._56_5_ = local_948._56_5_;
          local_3a8._48_8_ = local_948._48_8_;
          local_3a8._32_8_ = local_948._32_8_;
          local_3a8._40_8_ = local_948._40_8_;
          local_3a8._16_8_ = local_948._16_8_;
          local_3a8._24_8_ = local_948._24_8_;
          local_3a8._0_8_ = local_948._0_8_;
          local_3a8._8_8_ = local_948._8_8_;
          local_3a8._64_4_ = local_948._64_4_;
          local_3a8[0x44] = local_948[0x44];
          local_3a8._72_8_ = local_900;
          local_9b8 = dVar19;
          ::soplex::infinity::__tls_init();
          local_e0 = 0x1000000000;
          local_128 = 0;
          uStack_120 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_f8 = 0;
          uStack_f0 = 0;
          uStack_eb = 0;
          uStack_e8 = 0;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_128,(double)local_858);
          local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_3f8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_3f8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_3f8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_3f8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_3f8.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_3f8.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_3f8.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_3f8.m_backend.exp = (eps->m_backend).exp;
          local_3f8.m_backend.neg = (eps->m_backend).neg;
          local_3f8.m_backend.fpclass = (eps->m_backend).fpclass;
          local_3f8.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar12 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_3a8,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_128,&local_3f8);
          if (bVar12) {
            local_448._61_3_ = local_998._61_3_;
            local_448._56_5_ = local_998._56_5_;
            local_448._48_8_ = local_998._48_8_;
            local_448._32_8_ = local_998._32_8_;
            local_448._40_8_ = local_998._40_8_;
            local_448._16_8_ = local_998._16_8_;
            local_448._24_8_ = local_998._24_8_;
            local_448._0_8_ = local_998._0_8_;
            local_448._8_8_ = local_998._8_8_;
            local_448._64_4_ = local_998._64_4_;
            local_448[0x44] = local_998[0x44];
            local_448._72_8_ = local_950;
            local_498._61_3_ = local_948._61_3_;
            local_498._56_5_ = local_948._56_5_;
            local_498._0_8_ = local_948._0_8_;
            local_498._8_8_ = local_948._8_8_;
            local_498._16_8_ = local_948._16_8_;
            local_498._24_8_ = local_948._24_8_;
            local_498._32_8_ = local_948._32_8_;
            local_498._40_8_ = local_948._40_8_;
            local_498._48_8_ = local_948._48_8_;
            local_498._64_4_ = local_948._64_4_;
            local_498[0x44] = local_948[0x44];
            local_498._72_8_ = local_900;
            local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_4e8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_4e8.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_4e8.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_4e8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_4e8.m_backend.data._M_elems._40_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 10);
            local_4e8.m_backend.data._M_elems._48_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
            local_4e8.m_backend.data._M_elems._56_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
            local_4e8.m_backend.exp = (eps->m_backend).exp;
            local_4e8.m_backend.neg = (eps->m_backend).neg;
            local_4e8.m_backend.fpclass = (eps->m_backend).fpclass;
            local_4e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar12 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_448,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_498,&local_4e8);
            if (bVar12) {
              local_a20 = 3.39519326554444e-313;
              local_a68._0_4_ = 0;
              local_a68._4_4_ = 0;
              local_a68._8_4_ = 0;
              local_a68._12_4_ = 0;
              local_a68._16_4_ = 0;
              local_a68._20_4_ = 0;
              local_a68._24_4_ = 0;
              local_a68._28_4_ = 0;
              local_a68._32_4_ = 0;
              local_a68._36_4_ = 0;
              local_a68._40_4_ = 0;
              local_a68._44_4_ = 0;
              local_a68._48_4_ = 0;
              local_a68._52_4_ = 0;
              local_a68._56_5_ = 0;
              local_a68._61_3_ = 0;
              local_a68._64_4_ = 0;
              local_a68[0x44] = false;
              if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_a68 == eps) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_a68,
                           (cpp_dec_float<100U,_int,_void> *)local_948);
                if (local_a68._0_4_ != 0 || local_a20._0_4_ != cpp_dec_float_finite) {
                  local_a68[0x44] = local_a68[0x44] ^ 1;
                }
              }
              else {
                local_a68._48_8_ = local_948._48_8_;
                local_a68._56_5_ = local_948._56_5_;
                local_a68._61_3_ = local_948._61_3_;
                local_a68._32_8_ = local_948._32_8_;
                local_a68._40_8_ = local_948._40_8_;
                local_a68._16_8_ = local_948._16_8_;
                local_a68._24_8_ = local_948._24_8_;
                local_a68._0_8_ = local_948._0_8_;
                local_a68._8_8_ = local_948._8_8_;
                local_a68._64_4_ = local_948._64_4_;
                local_a68[0x44] = local_948[0x44];
                local_a20 = local_900;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_a68,&eps->m_backend);
              }
              pcVar15 = &local_8d0[(long)local_9b8].m_backend;
              if (((pcVar15->fpclass != cpp_dec_float_NaN) && (local_a20._0_4_ != cpp_dec_float_NaN)
                  ) && ((iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                                  compare(pcVar15,(cpp_dec_float<100U,_int,_void> *)local_a68),
                        -1 < iVar13 && (stat[(long)local_9b8] * local_9a0->theRep < 0)))) {
                local_9b8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            extract_double(&local_7e8);
                local_8c8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            extract_double(&local_838);
                RVar2 = Random::next_random(local_8e8);
                local_a08.fpclass = cpp_dec_float_finite;
                local_a08.prec_elem = 0x10;
                local_a08.data._M_elems[0] = 0;
                local_a08.data._M_elems[1] = 0;
                local_a08.data._M_elems[2] = 0;
                local_a08.data._M_elems[3] = 0;
                local_a08.data._M_elems[4] = 0;
                local_a08.data._M_elems[5] = 0;
                local_a08.data._M_elems[6] = 0;
                local_a08.data._M_elems[7] = 0;
                local_a08.data._M_elems[8] = 0;
                local_a08.data._M_elems[9] = 0;
                local_a08.data._M_elems[10] = 0;
                local_a08.data._M_elems[0xb] = 0;
                local_a08.data._M_elems[0xc] = 0;
                local_a08.data._M_elems[0xd] = 0;
                local_a08.data._M_elems._56_5_ = 0;
                local_a08.data._M_elems[0xf]._1_3_ = 0;
                local_a08.exp = 0;
                local_a08.neg = false;
                local_a20 = 3.39519326554444e-313;
                local_a68._0_4_ = 0;
                local_a68._4_4_ = 0;
                local_a68._8_4_ = 0;
                local_a68._12_4_ = 0;
                local_a68._16_4_ = 0;
                local_a68._20_4_ = 0;
                local_a68._24_4_ = 0;
                local_a68._28_4_ = 0;
                local_a68._32_4_ = 0;
                local_a68._36_4_ = 0;
                local_a68._40_4_ = 0;
                local_a68._44_4_ = 0;
                local_a68._48_4_ = 0;
                local_a68._52_4_ = 0;
                local_a68._56_5_ = 0;
                local_a68._61_3_ = 0;
                local_a68._64_4_ = 0;
                local_a68[0x44] = false;
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)local_a68,
                           RVar2 * local_8c8 + (1.0 - RVar2) * local_9b8);
                if (&local_a08 != pcVar15) {
                  local_a08.data._M_elems._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
                  local_a08.data._M_elems._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
                  local_a08.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
                  local_a08.data._M_elems._24_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 6);
                  local_a08.data._M_elems._32_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 8);
                  local_a08.data._M_elems._40_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 10);
                  local_a08.data._M_elems._48_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar15->data)._M_elems + 0xe);
                  local_a08.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_a08.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_a08.exp = pcVar15->exp;
                  local_a08.neg = pcVar15->neg;
                  local_a08.fpclass = pcVar15->fpclass;
                  local_a08.prec_elem = pcVar15->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&local_a08,(cpp_dec_float<100U,_int,_void> *)local_a68);
                pnVar20 = (local_8d8->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x30);
                *(undefined8 *)puVar1 = local_a08.data._M_elems._48_8_;
                *(ulong *)(puVar1 + 2) =
                     CONCAT35(local_a08.data._M_elems[0xf]._1_3_,local_a08.data._M_elems._56_5_);
                puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x20);
                *(undefined8 *)puVar1 = local_a08.data._M_elems._32_8_;
                *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._40_8_;
                puVar1 = (uint *)((long)&pnVar20[(long)dVar19].m_backend.data + 0x10);
                *(undefined8 *)puVar1 = local_a08.data._M_elems._16_8_;
                *(undefined8 *)(puVar1 + 2) = local_a08.data._M_elems._24_8_;
                *(undefined8 *)&pnVar20[(long)dVar19].m_backend.data = local_a08.data._M_elems._0_8_
                ;
                *(undefined8 *)((long)&pnVar20[(long)dVar19].m_backend.data + 8) =
                     local_a08.data._M_elems._8_8_;
                pnVar20[(long)dVar19].m_backend.exp = local_a08.exp;
                pnVar20[(long)dVar19].m_backend.neg = local_a08.neg;
                pnVar20[(long)dVar19].m_backend.fpclass = local_a08.fpclass;
                pnVar20[(long)dVar19].m_backend.prec_elem = local_a08.prec_elem;
                pnVar20 = (local_8d8->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)dVar19;
                local_a20 = 3.39519326554444e-313;
                local_a68._0_4_ = 0;
                local_a68._4_4_ = 0;
                local_a68._8_4_ = 0;
                local_a68._12_4_ = 0;
                local_a68._16_4_ = 0;
                local_a68._20_4_ = 0;
                local_a68._24_4_ = 0;
                local_a68._28_4_ = 0;
                local_a68._32_4_ = 0;
                local_a68._36_4_ = 0;
                local_a68._40_4_ = 0;
                local_a68._44_4_ = 0;
                local_a68._48_4_ = 0;
                local_a68._52_4_ = 0;
                local_a68._56_5_ = 0;
                local_a68._61_3_ = 0;
                local_a68._64_4_ = 0;
                local_a68[0x44] = false;
                if ((pointer)local_a68 != pnVar20) {
                  local_a68._0_8_ = *(undefined8 *)&(pnVar20->m_backend).data;
                  local_a68._8_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 8);
                  local_a68._16_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x10);
                  local_a68._24_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x18);
                  local_a68._32_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x20);
                  local_a68._40_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x28);
                  local_a68._48_8_ = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x30);
                  uVar3 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x38);
                  local_a68._56_5_ = (undefined5)uVar3;
                  local_a68._61_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_a68._64_4_ = (pnVar20->m_backend).exp;
                  local_a68[0x44] = (pnVar20->m_backend).neg;
                  local_a20 = *(double *)&(pnVar20->m_backend).fpclass;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_a68,
                           (cpp_dec_float<100U,_int,_void> *)local_948);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_8f0,(cpp_dec_float<100U,_int,_void> *)local_a68);
              }
            }
          }
        }
        uVar16 = uVar16 - incr;
      } while (-1 < (int)uVar16);
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_8f0;
}

Assistant:

R SPxSolverBase<R>::perturbMax(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   const typename SPxBasisBase<R>::Desc::Status* stat,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;
   R l_theShift = 0;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps && rep() * stat[i] < 0)
         {
            p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
            l_theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps && rep() * stat[i] < 0)
         {
            p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
            l_theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         if(x > eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps && rep() * stat[i] < 0)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               l_theShift += p_up[i] - u;
            }
         }
         else if(x < -eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps && rep() * stat[i] < 0)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               l_theShift -= p_low[i] - l;
            }
         }
      }
   }

   return l_theShift;
}